

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

void Cmd_togglemessages(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  char *pcVar2;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  bVar1 = FBoolCVar::operator_cast_to_bool(&show_messages);
  if (bVar1) {
    pcVar2 = FStringTable::operator()(&GStrings,"MSGOFF");
    Printf(0x80,"%s\n",pcVar2);
    FBoolCVar::operator=(&show_messages,false);
  }
  else {
    pcVar2 = FStringTable::operator()(&GStrings,"MSGON");
    Printf(0x80,"%s\n",pcVar2);
    FBoolCVar::operator=(&show_messages,true);
  }
  return;
}

Assistant:

CCMD (togglemessages)
{
	if (show_messages)
	{
		Printf (128, "%s\n", GStrings("MSGOFF"));
		show_messages = false;
	}
	else
	{
		Printf (128, "%s\n", GStrings("MSGON"));
		show_messages = true;
	}
}